

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O2

int Aig_TsiStateCount(Aig_Tsi_t *p,uint *pState)

{
  int iVar1;
  uint uVar2;
  uint i;
  
  uVar2 = 0;
  iVar1 = 0;
  for (i = 0; (int)i < p->pAig->nRegs; i = i + 1) {
    Aig_ManLi(p->pAig,i);
    Aig_ManLo(p->pAig,i);
    iVar1 = iVar1 + (uint)(((uint)((pState[i >> 4] >> (uVar2 & 0x1e) & 1) != 0) +
                           (pState[i >> 4] >> (((byte)uVar2 & 0x1e) + 1 & 0x1f) & 1) * 2) - 1 < 2);
    uVar2 = uVar2 + 2;
  }
  return iVar1;
}

Assistant:

int Aig_TsiStateCount( Aig_Tsi_t * p, unsigned * pState )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    int i, Value, nCounter = 0;
    Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObjLo, i )
    {
        Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
        nCounter += (Value == 1 || Value == 2);
    }
    return nCounter;
}